

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

tadsobj_objid_and_ptr * __thiscall vm_tadsobj_hdr::get_inh_search_path(vm_tadsobj_hdr *this)

{
  ushort uVar1;
  vm_obj_id_t obj;
  CVmObjTads *objp;
  int iVar2;
  undefined4 extraout_var;
  tadsobj_objid_and_ptr *ptVar3;
  vm_tadsobj_hdr *pvVar4;
  pfq_ele *ppVar5;
  CVmObjTadsInhQueue *pCVar6;
  long lVar7;
  pfq_ele *local_40;
  
  if (this->inh_path != (tadsobj_objid_and_ptr *)0x0) {
    return this->inh_path;
  }
  CVmObjTadsInhQueue::clear(&G_tadsobj_queue_X);
  ppVar5 = (pfq_ele *)0x0;
  pvVar4 = this;
  do {
    uVar1 = pvVar4->sc_cnt;
    local_40 = ppVar5;
    for (lVar7 = 0; (uint)uVar1 << 4 != (int)lVar7; lVar7 = lVar7 + 0x10) {
      obj = *(vm_obj_id_t *)((long)&pvVar4->sc[0].id + lVar7);
      objp = *(CVmObjTads **)((long)&pvVar4->sc[0].objp + lVar7);
      iVar2 = (**(objp->super_CVmObject)._vptr_CVmObject)(objp);
      if ((CVmMetaclass *)CONCAT44(extraout_var,iVar2) == CVmObjTads::metaclass_reg_) {
        local_40 = CVmObjTadsInhQueue::insert_obj(&G_tadsobj_queue_X,obj,objp,local_40);
      }
    }
    do {
      if (ppVar5 == (pfq_ele *)0x0) {
        pCVar6 = &G_tadsobj_queue_X;
      }
      else {
        pCVar6 = (CVmObjTadsInhQueue *)&ppVar5->nxt;
      }
      ppVar5 = pCVar6->head_;
      if (ppVar5 == (pfq_ele *)0x0) {
        ptVar3 = CVmObjTadsInhQueue::create_path(&G_tadsobj_queue_X);
        this->inh_path = ptVar3;
        return ptVar3;
      }
    } while (ppVar5->obj == 0);
    pvVar4 = (vm_tadsobj_hdr *)(ppVar5->objp->super_CVmObject).ext_;
  } while( true );
}

Assistant:

tadsobj_objid_and_ptr *vm_tadsobj_hdr::get_inh_search_path(VMG0_)
{
    /* if we have a cached path, return it */
    if (inh_path != 0)
        return inh_path;

    /* get the queue builder global */
    CVmObjTadsInhQueue *q = G_tadsobj_queue;

    /*
     *   We haven't already cached a search path for this object, so build
     *   the search path now and save it for future searches.  Start by
     *   clearing the work queue.  
     */
    q->clear();

    /* we're not yet processing the first element */
    pfq_ele *q_ele = 0;

    /* start with self */
    vm_tadsobj_hdr *curhdr = this;

    /* keep going until we run out of queue elements */
    for (;;)
    {
        /* get the superclass count for this object */
        uint cnt = curhdr->sc_cnt;

        /* insert my superclasses right after me */
        pfq_ele *q_ins = q_ele;

        /* enqueue the current object's superclasses */
        uint i;
        vm_tadsobj_sc *scp;
        for (i = 0, scp = curhdr->sc ; i < cnt ; ++i, ++scp)
        {
            /* get the current superclass */
            vm_obj_id_t sc = scp->id;
            CVmObjTads *scobj = scp->objp;

            /* if it's not a TadsObject, skip it */
            if (scobj->get_metaclass_reg() != CVmObjTads::metaclass_reg_)
                continue;

            /* enqueue this superclass */
            q_ins = q->insert_obj(vmg_ sc, scobj, q_ins);
        }

        /* move to the next valid element */
        do
        {
            /* get the next queue element */
            q_ele = (q_ele == 0 ? q->get_head() : q_ele->nxt);

            /* if we're out of elements, we're done */
            if (q_ele == 0)
                goto done;
        }
        while (q_ele->obj == VM_INVALID_OBJ);

        /* get the object header for the queue item */
        curhdr = q_ele->objp->get_hdr();
    }

done:
    /* create and cache a linearized path for the queue, and return it */
    return inh_path = q->create_path();
}